

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::ArgumentSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != EmptyArgument) && (kind != NamedArgument)) && (kind != OrderedArgument)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ArgumentSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EmptyArgument:
        case SyntaxKind::NamedArgument:
        case SyntaxKind::OrderedArgument:
            return true;
        default:
            return false;
    }
}